

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

bool __thiscall libcellml::Annotator::assignAllIds(Annotator *this)

{
  int iVar1;
  pointer puVar2;
  int iVar3;
  LoggerImpl *pLVar4;
  AnnotatorImpl *pAVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar6;
  
  pLVar4 = Logger::pFunc(&this->super_Logger);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            pLVar4[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = this_00->_M_use_count;
    do {
      if (iVar3 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar6 = iVar3 == iVar1;
      if (bVar6) {
        this_00->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar6);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar6 = true;
  }
  else {
    bVar6 = this_00->_M_use_count == 0;
  }
  if ((bVar6) ||
     (pLVar4[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish == (pointer)0x0)) {
    pAVar5 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
    AnnotatorImpl::addIssueNoModel(pAVar5);
    bVar6 = false;
  }
  else {
    pLVar4 = Logger::pFunc(&this->super_Logger);
    puVar2 = pLVar4[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar5 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
    AnnotatorImpl::doSetAllAutomaticIds(pAVar5);
    pLVar4 = Logger::pFunc(&this->super_Logger);
    bVar6 = puVar2 < pLVar4[1].mMessages.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return bVar6;
}

Assistant:

bool Annotator::assignAllIds()
{
    auto model = pFunc()->mModel.lock();
    if (model != nullptr) {
        size_t initialSize = pFunc()->idCount();
        pFunc()->doSetAllAutomaticIds();
        return pFunc()->idCount() > initialSize;
    }
    pFunc()->addIssueNoModel();
    return false;
}